

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_som.cxx
# Opt level: O3

void __thiscall xray_re::xr_level_som::load(xr_level_som *this,xr_reader *r)

{
  undefined8 *puVar1;
  uint8_t *puVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  size_t sVar8;
  som_poly *psVar9;
  long lVar10;
  ulong uVar11;
  uint32_t version;
  int local_2c;
  
  sVar8 = xr_reader::r_raw_chunk(r,0,&local_2c,4);
  if (sVar8 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_som.cxx"
                  ,0x10,"void xray_re::xr_level_som::load(xr_reader &)");
  }
  if (local_2c == 0) {
    sVar8 = xr_reader::find_chunk(r,1);
    if (sVar8 != 0) {
      uVar11 = (sVar8 / 0x2c) * 0x2c;
      if (sVar8 == uVar11) {
        psVar9 = (som_poly *)operator_new__(uVar11);
        this->m_polys = psVar9;
        if (0x2b < sVar8) {
          lVar10 = 0;
          puVar2 = (r->field_2).m_p;
          do {
            uVar3 = *(undefined8 *)puVar2;
            uVar4 = *(undefined8 *)(puVar2 + 8);
            uVar5 = *(undefined8 *)(puVar2 + 0x10);
            uVar6 = *(undefined8 *)(puVar2 + 0x18);
            uVar7 = *(undefined8 *)(puVar2 + 0x24);
            puVar1 = (undefined8 *)((long)&psVar9->field_0 + lVar10 + 0x1c);
            *puVar1 = *(undefined8 *)(puVar2 + 0x1c);
            puVar1[1] = uVar7;
            puVar1 = (undefined8 *)((long)&psVar9->field_0 + lVar10 + 0x10);
            *puVar1 = uVar5;
            puVar1[1] = uVar6;
            puVar1 = (undefined8 *)((long)&psVar9->field_0 + lVar10);
            *puVar1 = uVar3;
            puVar1[1] = uVar4;
            (r->field_2).m_p = puVar2 + 0x2c;
            lVar10 = lVar10 + 0x2c;
            puVar2 = puVar2 + 0x2c;
          } while (uVar11 - lVar10 != 0);
        }
        this->m_num_polys = (uint32_t)(sVar8 / 0x2c);
        return;
      }
    }
    __assert_fail("size && (size % sizeof(som_poly) == 0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_som.cxx"
                  ,0x14,"void xray_re::xr_level_som::load(xr_reader &)");
  }
  __assert_fail("version == SOM_VERSION",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_som.cxx"
                ,0x11,"void xray_re::xr_level_som::load(xr_reader &)");
}

Assistant:

void xr_level_som::load(xr_reader& r)
{
	uint32_t version;
	if (!r.r_chunk(SOM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == SOM_VERSION);

	size_t size = r.find_chunk(SOM_CHUNK_POLYGONS);
	xr_assert(size && (size % sizeof(som_poly) == 0));
	m_polys = new som_poly[size /= sizeof(som_poly)];
	r.r_cseq(size, m_polys);
	m_num_polys = uint32_t(size & UINT32_MAX);
}